

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_mct_encode(opj_tcd_t *p_tcd)

{
  opj_tcd_tile_t *poVar1;
  OPJ_BOOL OVar2;
  OPJ_SIZE_T n;
  OPJ_BYTE **pData;
  opj_tcp_t *l_tcp;
  OPJ_BYTE **l_data;
  OPJ_UINT32 i;
  OPJ_SIZE_T samples;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcd_tile_t *l_tile;
  opj_tcd_t *p_tcd_local;
  
  poVar1 = p_tcd->tcd_image->tiles;
  samples = (OPJ_SIZE_T)p_tcd->tcd_image->tiles->comps;
  n = (long)(((opj_tcd_tilecomp_t *)samples)->x1 - ((opj_tcd_tilecomp_t *)samples)->x0) *
      (long)(((opj_tcd_tilecomp_t *)samples)->y1 - ((opj_tcd_tilecomp_t *)samples)->y0);
  if (p_tcd->tcp->mct == 0) {
    return 1;
  }
  if (p_tcd->tcp->mct == 2) {
    if (p_tcd->tcp->m_mct_coding_matrix == (OPJ_FLOAT32 *)0x0) {
      return 1;
    }
    pData = (OPJ_BYTE **)opj_malloc((ulong)poVar1->numcomps << 3);
    if (pData == (OPJ_BYTE **)0x0) {
      return 0;
    }
    for (l_data._4_4_ = 0; l_data._4_4_ < poVar1->numcomps; l_data._4_4_ = l_data._4_4_ + 1) {
      pData[l_data._4_4_] = *(OPJ_BYTE **)(samples + 0x30);
      samples = samples + 0x70;
    }
    OVar2 = opj_mct_encode_custom
                      ((OPJ_BYTE *)p_tcd->tcp->m_mct_coding_matrix,n,pData,poVar1->numcomps,
                       p_tcd->image->comps->sgnd);
    if (OVar2 == 0) {
      opj_free(pData);
      return 0;
    }
    opj_free(pData);
  }
  else if (p_tcd->tcp->tccps->qmfbid == 0) {
    opj_mct_encode_real(poVar1->comps->data,poVar1->comps[1].data,poVar1->comps[2].data,n);
  }
  else {
    opj_mct_encode(poVar1->comps->data,poVar1->comps[1].data,poVar1->comps[2].data,n);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_tcd_mct_encode(opj_tcd_t *p_tcd)
{
    opj_tcd_tile_t * l_tile = p_tcd->tcd_image->tiles;
    opj_tcd_tilecomp_t * l_tile_comp = p_tcd->tcd_image->tiles->comps;
    OPJ_SIZE_T samples = (OPJ_SIZE_T)(l_tile_comp->x1 - l_tile_comp->x0) *
                         (OPJ_SIZE_T)(l_tile_comp->y1 - l_tile_comp->y0);
    OPJ_UINT32 i;
    OPJ_BYTE ** l_data = 00;
    opj_tcp_t * l_tcp = p_tcd->tcp;

    if (!p_tcd->tcp->mct) {
        return OPJ_TRUE;
    }

    if (p_tcd->tcp->mct == 2) {
        if (! p_tcd->tcp->m_mct_coding_matrix) {
            return OPJ_TRUE;
        }

        l_data = (OPJ_BYTE **) opj_malloc(l_tile->numcomps * sizeof(OPJ_BYTE*));
        if (! l_data) {
            return OPJ_FALSE;
        }

        for (i = 0; i < l_tile->numcomps; ++i) {
            l_data[i] = (OPJ_BYTE*) l_tile_comp->data;
            ++l_tile_comp;
        }

        if (! opj_mct_encode_custom(/* MCT data */
                    (OPJ_BYTE*) p_tcd->tcp->m_mct_coding_matrix,
                    /* size of components */
                    samples,
                    /* components */
                    l_data,
                    /* nb of components (i.e. size of pData) */
                    l_tile->numcomps,
                    /* tells if the data is signed */
                    p_tcd->image->comps->sgnd)) {
            opj_free(l_data);
            return OPJ_FALSE;
        }

        opj_free(l_data);
    } else if (l_tcp->tccps->qmfbid == 0) {
        opj_mct_encode_real(l_tile->comps[0].data, l_tile->comps[1].data,
                            l_tile->comps[2].data, samples);
    } else {
        opj_mct_encode(l_tile->comps[0].data, l_tile->comps[1].data,
                       l_tile->comps[2].data, samples);
    }

    return OPJ_TRUE;
}